

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbox.cpp
# Opt level: O2

void __thiscall QToolBox::setItemEnabled(QToolBox *this,int index,bool enabled)

{
  QToolBoxPrivate *this_00;
  Page *pPVar1;
  int index_00;
  int iVar2;
  int iVar3;
  int index_01;
  
  this_00 = *(QToolBoxPrivate **)&(this->super_QFrame).super_QWidget.field_0x8;
  pPVar1 = QToolBoxPrivate::page(this_00,index);
  if (((pPVar1 == (Page *)0x0) || (QWidget::setEnabled((QWidget *)pPVar1->button,enabled), enabled))
     || (pPVar1 != this_00->currentPage)) {
    return;
  }
  iVar2 = (int)((ulong)((long)(this_00->pageList).
                              super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this_00->pageList).
                             super__Vector_base<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>,_std::allocator<std::unique_ptr<QToolBoxPrivate::Page,_std::default_delete<QToolBoxPrivate::Page>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) + -1;
  index_00 = index;
  iVar3 = index;
  do {
    do {
      if ((iVar3 < 1) && (index_01 = index, iVar2 <= index_00)) goto LAB_004764f5;
      if (index_00 < iVar2) {
        index_00 = index_00 + 1;
        pPVar1 = QToolBoxPrivate::page(this_00,index_00);
        index_01 = index_00;
        if ((((pPVar1->button->super_QAbstractButton).super_QWidget.data)->widget_attributes & 1) ==
            0) goto LAB_004764f5;
      }
    } while (iVar3 < 1);
    index_01 = iVar3 + -1;
    pPVar1 = QToolBoxPrivate::page(this_00,index_01);
    iVar3 = index_01;
  } while ((((pPVar1->button->super_QAbstractButton).super_QWidget.data)->widget_attributes & 1) !=
           0);
LAB_004764f5:
  setCurrentIndex(this,index_01);
  return;
}

Assistant:

void QToolBox::setItemEnabled(int index, bool enabled)
{
    Q_D(QToolBox);
    QToolBoxPrivate::Page *c = d->page(index);
    if (!c)
        return;

    c->button->setEnabled(enabled);
    if (!enabled && c == d->currentPage) {
        int curIndexUp = index;
        int curIndexDown = curIndexUp;
        const int count = static_cast<int>(d->pageList.size());
        while (curIndexUp > 0 || curIndexDown < count-1) {
            if (curIndexDown < count-1) {
                if (d->page(++curIndexDown)->button->isEnabled()) {
                    index = curIndexDown;
                    break;
                }
            }
            if (curIndexUp > 0) {
                if (d->page(--curIndexUp)->button->isEnabled()) {
                    index = curIndexUp;
                    break;
                }
            }
        }
        setCurrentIndex(index);
    }
}